

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Edge *graph;
  time_t tVar3;
  ulong uVar4;
  uint graphSize;
  char *__format;
  long lVar5;
  int startNode;
  int local_8c;
  ulong local_88;
  char **local_80;
  Solution local_74;
  
  uVar4 = (ulong)(uint)argc;
  name = *argv;
  local_80 = argv;
  graph = (Edge *)malloc((long)argc * 8 - 8);
  load_buffer();
  if (argc == 1) {
    clean_loaded_buffer();
    __format = "%s ERROR: graph has to have at least one edge\n";
  }
  else {
    iVar1 = increment_state();
    if (iVar1 == 0) {
      tVar3 = time((time_t *)0x0);
      iVar1 = get_state();
      srand((int)tVar3 + iVar1 * 1000);
      local_74.edges[0].start = 0;
      local_8c = 0;
      local_88 = uVar4;
      if (1 < argc) {
        lVar5 = 0;
        do {
          iVar1 = __isoc99_sscanf(local_80[lVar5 + 1],"%d-%d",&local_74,&local_8c);
          if (((iVar1 != 2) || (local_74.edges[0].start < 0)) || (local_8c < 0)) {
            clean_loaded_buffer();
            __format = 
            "%s ERROR: edge format has to be \'node\'-\'node\'\nall nodes have to be a positiv integer values\n\n"
            ;
            goto LAB_001015d2;
          }
          graph[lVar5].start = local_74.edges[0].start;
          graph[lVar5].end = local_8c;
          lVar5 = lVar5 + 1;
        } while (uVar4 - 1 != lVar5);
      }
      graphSize = (int)local_88 - 1;
      iVar1 = 1;
      if (1 < (int)local_88) {
        uVar4 = 0;
        iVar1 = 0;
        do {
          if (iVar1 < graph[uVar4].start) {
            iVar1 = graph[uVar4].start;
          }
          if (iVar1 < graph[uVar4].end) {
            iVar1 = graph[uVar4].end;
          }
          uVar4 = uVar4 + 1;
        } while (graphSize != uVar4);
        iVar1 = iVar1 + 1;
      }
      iVar2 = get_state();
      if (0 < iVar2) {
        do {
          calculate_one_solution(&local_74,graphSize,graph,iVar1);
          if (local_74.amount < 8) {
            iVar2 = circ_buf_write(&local_74);
            if (iVar2 != 0) {
              __format = "%s ERROR: error writing to shared memory\n";
              goto LAB_001015d2;
            }
          }
          iVar2 = get_state();
        } while (0 < iVar2);
      }
      free(graph);
      sem_post((sem_t *)free_sem);
      clean_loaded_buffer();
      exit(0);
    }
    __format = "%s ERROR: couldn\'t increment system state\n";
  }
LAB_001015d2:
  fprintf(_stderr,__format,name);
  exit(1);
}

Assistant:

int main(int argc, const char **argv)
{
    name = argv[0];
    Edge *graph = malloc(sizeof(Edge) * (argc - 1));

    load_buffer();

    if (1 == argc)
    {
        clean_loaded_buffer();
        ERROR_EXIT("graph has to have at least one edge");
    }

    if (increment_state() != 0)
    {
        ERROR_EXIT("couldn't increment system state");
    }
    srand(time(0) + get_state() * 1000);

    read_input(argc, argv, graph);

    int amountVertices = get_max_node(graph, argc-1);

    int state;
    while ((state = get_state()) > 0)
    {
        Solution returns = calculate_one_solution(argc-1, graph, amountVertices);

        if (returns.amount < MAXRETURN)
        {
#ifdef DEBUG
            printEdge(returns.edges, returns.amount);
#endif
            if (circ_buf_write(&returns) != 0)
            {
                ERROR_EXIT("error writing to shared memory");
            }
        }
        else
        {
#ifdef DEBUG
            fprintf(stdout, "Solution too Big");
#endif
        }
    }

    free(graph);
    sem_post(free_sem);

    clean_loaded_buffer();
    exit(EXIT_SUCCESS);
}